

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::ChimpScanState<double>::ScanGroup<unsigned_long>
          (ChimpScanState<double> *this,unsigned_long *values,idx_t group_size)

{
  idx_t *piVar1;
  
  if (((this->total_value_count & 0x3ff) == 0) && (this->total_value_count < this->segment_count)) {
    if (group_size == 0x400) {
      LoadGroup(this,values);
      group_size = 0x400;
      goto LAB_014b9a0d;
    }
    LoadGroup(this,(this->group_state).values);
  }
  switchD_01939fa4::default
            (values,(this->group_state).values + (this->group_state).index,group_size * 8);
  piVar1 = &(this->group_state).index;
  *piVar1 = *piVar1 + group_size;
LAB_014b9a0d:
  this->total_value_count = this->total_value_count + group_size;
  return;
}

Assistant:

void ScanGroup(CHIMP_TYPE *values, idx_t group_size) {
		D_ASSERT(group_size <= ChimpPrimitives::CHIMP_SEQUENCE_SIZE);
		D_ASSERT(group_size <= LeftInGroup());

		if (GroupFinished() && total_value_count < segment_count) {
			if (group_size == ChimpPrimitives::CHIMP_SEQUENCE_SIZE) {
				LoadGroup(values);
				total_value_count += group_size;
				return;
			} else {
				LoadGroup(group_state.values);
			}
		}
		group_state.Scan(values, group_size);
		total_value_count += group_size;
	}